

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

bool libcellml::Units::compatible(UnitsPtr *units1,UnitsPtr *units2)

{
  Units *this;
  bool bVar1;
  bool bVar2;
  iterator iVar3;
  _Base_ptr p_Var4;
  UnitsPtr *units;
  UnitsPtr *units_00;
  UnitsMap units2Map;
  UnitsMap units1Map;
  string unit;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  local_b0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  local_80;
  key_type local_50;
  
  this = (units1->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if ((((this == (Units *)0x0) ||
       ((units2->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
        (element_type *)0x0)) || (bVar1 = isDefined(this), !bVar1)) ||
     (bVar1 = isDefined((units2->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>).
                        _M_ptr), !bVar1)) {
    return false;
  }
  defineUnitsMap_abi_cxx11_((UnitsMap *)&local_80,(libcellml *)units1,units);
  defineUnitsMap_abi_cxx11_((UnitsMap *)&local_b0,(libcellml *)units2,units_00);
  if (local_80._M_impl.super__Rb_tree_header._M_node_count ==
      local_b0._M_impl.super__Rb_tree_header._M_node_count) {
    for (p_Var4 = local_80._M_impl.super__Rb_tree_header._M_header._M_left;
        bVar1 = (_Rb_tree_header *)p_Var4 == &local_80._M_impl.super__Rb_tree_header, !bVar1;
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
      std::__cxx11::string::string((string *)&local_50,(string *)(p_Var4 + 1));
      iVar3 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
              ::find(&local_b0,&local_50);
      if ((_Rb_tree_header *)iVar3._M_node == &local_b0._M_impl.super__Rb_tree_header) {
        std::__cxx11::string::~string((string *)&local_50);
        goto LAB_0020f5e0;
      }
      bVar2 = areEqual(*(double *)(iVar3._M_node + 2),*(double *)(p_Var4 + 2));
      std::__cxx11::string::~string((string *)&local_50);
      if (!bVar2) break;
    }
  }
  else {
LAB_0020f5e0:
    bVar1 = false;
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  ::~_Rb_tree(&local_b0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  ::~_Rb_tree(&local_80);
  return bVar1;
}

Assistant:

bool Units::compatible(const UnitsPtr &units1, const UnitsPtr &units2)
{
    // Initial checks.
    if ((units1 == nullptr) || (units2 == nullptr)) {
        return false;
    }
    if ((!units1->isDefined()) || (!units2->isDefined())) {
        return false;
    }

    UnitsMap units1Map = defineUnitsMap(units1);
    UnitsMap units2Map = defineUnitsMap(units2);

    if (units1Map.size() == units2Map.size()) {
        for (const auto &units : units1Map) {
            std::string unit = units.first;
            auto found = units2Map.find(unit);

            if (found == units2Map.end()) {
                return false;
            }
            if (!areEqual(found->second, units.second)) {
                return false;
            }
        }

        return true;
    }

    return false;
}